

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Evaluate
          (WindowDistinctAggregatorLocalState *this,WindowDistinctAggregatorGlobalState *gdstate,
          DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  pointer puVar1;
  size_type __n;
  WindowExcludeMode WVar2;
  pointer puVar3;
  value_type vVar4;
  WindowDistinctSortTree *pWVar5;
  SubFrames *pSVar6;
  WindowDistinctAggregatorLocalState *pWVar7;
  WindowAggregateStates *this_00;
  ulong uVar8;
  const_reference pvVar9;
  reference pvVar10;
  const_reference pvVar11;
  ulong uVar12;
  unsigned_long *puVar13;
  unsigned_long uVar14;
  const_reference pvVar15;
  unsigned_long uVar16;
  idx_t iVar17;
  size_type __n_00;
  pointer puVar18;
  ulong uVar19;
  size_type __n_01;
  vector<unsigned_long,_true> *this_01;
  idx_t run_begin;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  ulong local_140;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  WindowDistinctSortTree *local_108;
  long local_100;
  SubFrames *local_f8;
  ulong local_f0;
  idx_t local_e8;
  size_type local_e0;
  WindowDistinctAggregatorLocalState *local_d8;
  WindowAggregateStates *local_d0;
  Vector *local_c8;
  data_ptr_t local_c0;
  data_ptr_t local_b8;
  data_ptr_t local_b0;
  data_ptr_t local_a8;
  WindowAggregateStates *local_a0;
  WindowDistinctAggregatorGlobalState *local_98;
  idx_t local_90;
  long local_88;
  size_type local_80;
  uchar **pdata;
  uchar **ldata;
  pointer local_68;
  anon_class_48_6_09f7b237 local_60;
  
  ldata = (uchar **)(this->statel).data;
  pdata = (uchar **)(this->statep).data;
  local_108 = &gdstate->merge_sort_tree;
  local_a0 = &gdstate->levels_flat_native;
  WVar2 = ((gdstate->super_WindowAggregatorGlobalState).aggregator)->exclude_mode;
  local_d0 = &this->statef;
  local_c8 = result;
  local_98 = gdstate;
  local_90 = count;
  WindowAggregateStates::Initialize(local_d0,count);
  local_f8 = &this->frames;
  local_d8 = this;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
  local_a8 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,7);
  local_b0 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,2);
  local_c0 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,3);
  local_b8 = pvVar9->data;
  iVar17 = 0;
  do {
    pSVar6 = local_f8;
    if (iVar17 == local_90) {
      FlushStates(local_d8);
      this_00 = local_d0;
      WindowAggregateStates::Finalize(local_d0,local_c8);
      WindowAggregateStates::Destroy(this_00);
      return;
    }
    uVar20 = *(ulong *)(local_a8 + iVar17 * 8);
    uVar23 = *(ulong *)(local_b0 + iVar17 * 8);
    local_f0 = row_idx;
    local_e8 = iVar17;
    if (WVar2 == NO_OTHER) {
      __n_00 = 0;
    }
    else {
      uVar24 = row_idx;
      if (WVar2 != CURRENT_ROW) {
        uVar24 = *(ulong *)(local_c0 + iVar17 * 8);
      }
      if (uVar23 <= uVar24) {
        uVar24 = uVar23;
      }
      if (uVar24 <= uVar20) {
        uVar24 = uVar20;
      }
      pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>(local_f8,0);
      pvVar10->start = uVar20;
      pvVar10->end = uVar24;
      if (WVar2 == TIES) {
        uVar24 = uVar20;
        if (uVar20 < local_f0) {
          uVar24 = local_f0;
        }
        if (uVar23 <= uVar24) {
          uVar24 = uVar23;
        }
        uVar19 = local_f0 + 1;
        if (uVar23 <= local_f0 + 1) {
          uVar19 = uVar23;
        }
        if (uVar19 <= uVar20) {
          uVar19 = uVar20;
        }
        pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>(pSVar6,1);
        pvVar10->start = uVar24;
        pvVar10->end = uVar19;
        __n_00 = 2;
LAB_00a85eb1:
        uVar24 = *(ulong *)(local_b8 + local_e8 * 8);
      }
      else {
        __n_00 = 1;
        if (WVar2 != CURRENT_ROW) goto LAB_00a85eb1;
        uVar24 = local_f0 + 1;
      }
      if (uVar20 < uVar24) {
        uVar20 = uVar24;
      }
      if (uVar23 <= uVar20) {
        uVar20 = uVar23;
      }
    }
    pSVar6 = local_f8;
    pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>(local_f8,__n_00);
    pWVar7 = local_d8;
    pvVar10->start = uVar20;
    pvVar10->end = uVar23;
    local_68 = (local_d8->statef).states.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
               .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + (local_d8->statef).state_size * local_e8;
    pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>(pSVar6,0);
    uVar20 = pvVar10->start;
    pvVar10 = vector<duckdb::FrameBounds,_true>::get<true>(pSVar6,0);
    pWVar5 = local_108;
    uVar23 = pvVar10->end;
    local_130 = uVar20 + 1;
    local_60.gdstate = local_98;
    local_60.levels_flat_native = local_a0;
    local_60.pdata = &pdata;
    local_60.this = pWVar7;
    local_60.agg_state = &local_68;
    local_60.ldata = &ldata;
    if (uVar20 < uVar23) {
      local_140 = uVar20;
      local_118 = uVar20;
      if (uVar23 - 1 != uVar20) {
        uVar19 = 0;
        uVar24 = 1;
        uVar8 = uVar23 - 1;
        uVar21 = uVar20;
        do {
          uVar12 = uVar8;
          uVar21 = uVar21 >> 5;
          uVar24 = uVar24 * 0x20;
          uVar19 = uVar19 + 1;
          uVar8 = uVar12 >> 5;
        } while (uVar21 != uVar12 >> 5);
        local_140 = uVar24 * uVar12 >> 5;
        local_128 = uVar23;
        local_118 = local_140;
        local_110 = uVar20;
        if (uVar19 < 3) {
          if (uVar19 == 0) goto LAB_00a85fa4;
        }
        else {
          uVar21 = uVar21 * uVar24;
          pvVar11 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                 *)local_108,0);
          uVar20 = (long)(pvVar11->first).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar11->first).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (uVar21 + uVar24 <= uVar20) {
            uVar20 = uVar21 + uVar24;
          }
          pvVar11 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                 *)pWVar5,uVar19);
          puVar3 = (pvVar11->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar13 = ::std::
                    __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                              (puVar3 + uVar21,puVar3 + uVar20,&local_130);
          uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                             ((long)puVar13 - (long)puVar3 >> 3);
          local_120 = (uVar21 / uVar24) * 0x40 + (uVar14 & 0xffffffffffffffe0);
          local_e0 = (uVar12 | 0xffffffffffffffe0) + local_120;
          local_120 = (uint)uVar12 & 0x1f | local_120;
          local_100 = -local_110;
          local_88 = -local_128;
          do {
            pWVar5 = local_108;
            __n = uVar19 - 1;
            uVar24 = uVar24 >> 5;
            pvVar11 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                   *)local_108,__n);
            puVar3 = (pvVar11->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_80 = uVar19;
            pvVar11 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                   *)pWVar5,uVar19);
            this_01 = &pvVar11->second;
            __n_01 = local_e0 + 0x1f;
            for (uVar20 = local_118; uVar24 <= local_100 + uVar20; uVar20 = uVar20 - uVar24) {
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,__n_01);
              vVar4 = *pvVar15;
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,__n_01 + 0x20);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar3 + vVar4,puVar3 + *pvVar15,&local_130);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar3 >> 3);
              Evaluate::anon_class_48_6_b8ed951a::operator()::anon_class_48_6_09f7b237::operator()
                        (&local_60,__n,uVar20 - uVar24,uVar14);
              __n_01 = __n_01 - 1;
            }
            local_118 = uVar20;
            if (local_100 + uVar20 != 0) {
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,__n_01);
              vVar4 = *pvVar15;
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,__n_01 + 0x20);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar3 + vVar4,puVar3 + *pvVar15,&local_130);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar3 >> 3);
              __n_01 = (local_110 / uVar24) * 0x40 + (uVar14 & 0xffffffffffffffe0);
            }
            local_e0 = __n_01;
            uVar20 = local_128 - local_140;
            while (uVar23 = local_120, bVar25 = uVar24 <= uVar20, uVar20 = uVar20 - uVar24, bVar25)
            {
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,local_120);
              vVar4 = *pvVar15;
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,uVar23 + 0x20);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar3 + vVar4,puVar3 + *pvVar15,&local_130);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar3 >> 3);
              Evaluate::anon_class_48_6_b8ed951a::operator()::anon_class_48_6_09f7b237::operator()
                        (&local_60,__n,local_140,uVar14);
              local_140 = local_140 + uVar24;
              local_120 = uVar23 + 1;
            }
            if (local_88 + local_140 != 0) {
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,local_120);
              vVar4 = *pvVar15;
              pvVar15 = vector<unsigned_long,_true>::get<true>(this_01,uVar23 + 0x20);
              puVar13 = ::std::
                        __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                  (puVar3 + vVar4,puVar3 + *pvVar15,&local_130);
              uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar13 - (long)puVar3 >> 3);
              local_120 = (local_128 / uVar24) * 0x40 + (uVar14 & 0xffffffffffffffe0);
            }
            uVar19 = __n;
          } while (2 < local_80);
          uVar19 = 1;
        }
        local_100 = -local_110;
        while (uVar19 = uVar19 - 1, uVar23 = local_128, uVar20 = local_110, uVar19 != 0) {
          uVar24 = uVar24 >> 5;
          pvVar11 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                 *)local_108,uVar19);
          puVar3 = (pvVar11->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar22 = local_118 * 8;
          local_120 = uVar24 * 8;
          puVar18 = puVar3 + local_118;
          for (uVar20 = local_118; uVar24 <= local_100 + uVar20; uVar20 = uVar20 - uVar24) {
            puVar13 = ::std::
                      __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                (puVar18 + -uVar24,puVar18,&local_130);
            uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar13 - (long)puVar3 >> 3);
            uVar16 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)(uVar24 * -8 + lVar22) >> 3);
            Evaluate::anon_class_48_6_b8ed951a::operator()::anon_class_48_6_09f7b237::operator()
                      (&local_60,uVar19,uVar16,uVar14);
            lVar22 = lVar22 - local_120;
            puVar18 = puVar18 + -uVar24;
          }
          uVar23 = local_128 - local_140;
          puVar18 = puVar3 + local_140;
          local_118 = uVar20;
          while (bVar25 = uVar24 <= uVar23, uVar23 = uVar23 - uVar24, bVar25) {
            puVar1 = (pointer)((long)puVar18 + local_120);
            puVar13 = ::std::
                      __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                                (puVar18,puVar1,&local_130);
            uVar14 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar13 - (long)puVar3 >> 3);
            uVar16 = NumericCastImpl<unsigned_long,_long,_false>::Convert(local_140);
            Evaluate::anon_class_48_6_b8ed951a::operator()::anon_class_48_6_09f7b237::operator()
                      (&local_60,uVar19,uVar16,uVar14);
            local_140 = local_140 + uVar24;
            puVar18 = puVar1;
          }
        }
      }
LAB_00a85fa4:
      pvVar11 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                ::get<true>((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                             *)local_108,0);
      puVar3 = (pvVar11->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; local_118 != uVar20; uVar20 = uVar20 + 1) {
        Evaluate::anon_class_48_6_b8ed951a::operator()::anon_class_48_6_09f7b237::operator()
                  (&local_60,0,uVar20,uVar20 + (puVar3[uVar20] < local_130));
      }
      for (; uVar23 != local_140; local_140 = local_140 + 1) {
        Evaluate::anon_class_48_6_b8ed951a::operator()::anon_class_48_6_09f7b237::operator()
                  (&local_60,0,local_140,local_140 + (puVar3[local_140] < local_130));
      }
    }
    iVar17 = local_e8 + 1;
    row_idx = local_f0 + 1;
  } while( true );
}

Assistant:

void WindowDistinctAggregatorLocalState::Evaluate(const WindowDistinctAggregatorGlobalState &gdstate,
                                                  const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) {
	auto ldata = FlatVector::GetData<const_data_ptr_t>(statel);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);

	const auto &merge_sort_tree = gdstate.merge_sort_tree;
	const auto &levels_flat_native = gdstate.levels_flat_native;
	const auto exclude_mode = gdstate.aggregator.exclude_mode;

	//	Build the finalise vector that just points to the result states
	statef.Initialize(count);

	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t rid) {
		auto agg_state = statef.GetStatePtr(rid);

		//	TODO: Extend AggregateLowerBound to handle subframes, just like SelectNth.
		const auto lower = frames[0].start;
		const auto upper = frames[0].end;
		merge_sort_tree.AggregateLowerBound(lower, upper, lower + 1,
		                                    [&](idx_t level, const idx_t run_begin, const idx_t run_pos) {
			                                    if (run_pos != run_begin) {
				                                    //	Find the source aggregate
				                                    // Buffer a merge of the indicated state into the current state
				                                    const auto agg_idx = gdstate.levels_flat_start[level] + run_pos - 1;
				                                    const auto running_agg = levels_flat_native.GetStatePtr(agg_idx);
				                                    pdata[flush_count] = agg_state;
				                                    ldata[flush_count++] = running_agg;
				                                    if (flush_count >= STANDARD_VECTOR_SIZE) {
					                                    FlushStates();
				                                    }
			                                    }
		                                    });
	});

	//	Flush the final states
	FlushStates();

	//	Finalise the result aggregates and write to the result
	statef.Finalize(result);

	//	Destruct any non-POD state
	statef.Destroy();
}